

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::LookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,
          MapValueConstRef *val)

{
  bool bVar1;
  Descriptor *this_00;
  FieldDescriptor *pFVar2;
  MapFieldBase *this_01;
  
  if (field->type_ == '\v') {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    if (bVar1) {
      this_00 = FieldDescriptor::message_type(field);
      pFVar2 = Descriptor::map_value(this_00);
      val->type_ = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar2->type_ * 4);
      this_01 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      internal::MapFieldBase::SyncMapWithRepeatedField(this_01);
      bVar1 = internal::MapFieldBase::LookupMapValueNoSync(this_01,key,val);
      return bVar1;
    }
  }
  anon_unknown_6::ReportReflectionUsageError
            (this->descriptor_,field,"LookupMapValue","Field is not a map field.");
}

Assistant:

bool Reflection::LookupMapValue(const Message& message,
                                const FieldDescriptor* field, const MapKey& key,
                                MapValueConstRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), LookupMapValue,
              "Field is not a map field.");
  val->SetType(field->message_type()->map_value()->cpp_type());
  return GetRaw<MapFieldBase>(message, field).LookupMapValue(key, val);
}